

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O1

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::sink_it_
          (rotating_file_sink<std::mutex> *this,log_msg *msg)

{
  formatter *pfVar1;
  size_t sVar2;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  ulong uVar3;
  memory_buf_t formatted;
  undefined1 *local_148;
  size_t sStack_140;
  undefined8 local_138;
  code *local_130;
  undefined1 local_128 [264];
  
  sStack_140 = 0;
  local_130 = ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::grow
  ;
  local_138 = 0xfa;
  pfVar1 = (this->super_base_sink<std::mutex>).formatter_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_148 = local_128;
  (*pfVar1->_vptr_formatter[2])(pfVar1,msg,&local_148);
  uVar3 = sStack_140 + this->current_size_;
  __buf = extraout_RDX;
  if (this->max_size_ < uVar3) {
    details::file_helper::flush(&this->file_helper_);
    sVar2 = details::file_helper::size(&this->file_helper_);
    __buf = extraout_RDX_00;
    if (sVar2 != 0) {
      rotate_(this);
      __buf = extraout_RDX_01;
      uVar3 = sStack_140;
    }
  }
  details::file_helper::write(&this->file_helper_,(int)&local_148,__buf,in_RCX);
  this->current_size_ = uVar3;
  if (local_148 != local_128) {
    free(local_148);
  }
  return;
}

Assistant:

SPDLOG_INLINE void rotating_file_sink<Mutex>::sink_it_(const details::log_msg &msg) {
    memory_buf_t formatted;
    base_sink<Mutex>::formatter_->format(msg, formatted);
    auto new_size = current_size_ + formatted.size();

    // rotate if the new estimated file size exceeds max size.
    // rotate only if the real size > 0 to better deal with full disk (see issue #2261).
    // we only check the real size when new_size > max_size_ because it is relatively expensive.
    if (new_size > max_size_) {
        file_helper_.flush();
        if (file_helper_.size() > 0) {
            rotate_();
            new_size = formatted.size();
        }
    }
    file_helper_.write(formatted);
    current_size_ = new_size;
}